

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O0

void __thiscall
QAccessibleMdiSubWindow::QAccessibleMdiSubWindow(QAccessibleMdiSubWindow *this,QWidget *widget)

{
  long lVar1;
  undefined8 in_RSI;
  Role role;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QWidget *w;
  QAccessibleWidget *in_stack_ffffffffffffffe0;
  
  role = (Role)((ulong)in_RSI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  w = in_RDI;
  QString::QString((QString *)0x7e4762);
  QAccessibleWidget::QAccessibleWidget(in_stack_ffffffffffffffe0,w,role,(QString *)in_RDI);
  QString::~QString((QString *)0x7e4784);
  *(undefined ***)in_RDI = &PTR__QAccessibleMdiSubWindow_00d287b8;
  *(undefined ***)&in_RDI->super_QPaintDevice = &PTR__QAccessibleMdiSubWindow_00d28888;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleMdiSubWindow::QAccessibleMdiSubWindow(QWidget *widget)
    : QAccessibleWidget(widget, QAccessible::Window)
{
    Q_ASSERT(qobject_cast<QMdiSubWindow *>(widget));
}